

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlUnlinkNode(xmlNodePtr cur)

{
  xmlElementType xVar1;
  _xmlDoc *p_Var2;
  _xmlNode *p_Var3;
  xmlNodePtr pxVar4;
  _xmlNode **pp_Var5;
  long lVar6;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (xVar1 == XML_NAMESPACE_DECL) {
    return;
  }
  if (xVar1 == XML_ENTITY_DECL) {
    p_Var2 = cur->doc;
    if (p_Var2 != (_xmlDoc *)0x0) {
      if (p_Var2->intSubset != (_xmlDtd *)0x0) {
        pxVar4 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var2->intSubset->entities,cur->name);
        if (pxVar4 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var2->intSubset->entities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
        pxVar4 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var2->intSubset->pentities,cur->name);
        if (pxVar4 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var2->intSubset->pentities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
      }
      if (p_Var2->extSubset != (_xmlDtd *)0x0) {
        pxVar4 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var2->extSubset->entities,cur->name);
        if (pxVar4 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var2->extSubset->entities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
        pxVar4 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var2->extSubset->pentities,cur->name);
        if (pxVar4 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var2->extSubset->pentities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
      }
    }
  }
  else if ((xVar1 == XML_DTD_NODE) && (p_Var2 = cur->doc, p_Var2 != (_xmlDoc *)0x0)) {
    if (p_Var2->intSubset == (_xmlDtd *)cur) {
      p_Var2->intSubset = (_xmlDtd *)0x0;
    }
    if (p_Var2->extSubset == (_xmlDtd *)cur) {
      p_Var2->extSubset = (_xmlDtd *)0x0;
    }
  }
  p_Var3 = cur->parent;
  if (p_Var3 == (_xmlNode *)0x0) goto LAB_00182462;
  if (cur->type == XML_ATTRIBUTE_NODE) {
    if ((xmlNodePtr)p_Var3->properties == cur) {
      pp_Var5 = (_xmlNode **)&p_Var3->properties;
      lVar6 = 0x30;
LAB_00182453:
      *pp_Var5 = *(_xmlNode **)((long)&cur->_private + lVar6);
    }
  }
  else {
    if (p_Var3->children == cur) {
      p_Var3->children = cur->next;
    }
    if (p_Var3->last == cur) {
      pp_Var5 = &p_Var3->last;
      lVar6 = 0x38;
      goto LAB_00182453;
    }
  }
  cur->parent = (_xmlNode *)0x0;
LAB_00182462:
  p_Var3 = cur->next;
  if (p_Var3 != (_xmlNode *)0x0) {
    p_Var3->prev = cur->prev;
  }
  if (cur->prev != (_xmlNode *)0x0) {
    cur->prev->next = p_Var3;
  }
  cur->next = (_xmlNode *)0x0;
  cur->prev = (_xmlNode *)0x0;
  return;
}

Assistant:

void
xmlUnlinkNode(xmlNodePtr cur) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlUnlinkNode : node == NULL\n");
#endif
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL)
        return;
    if (cur->type == XML_DTD_NODE) {
	xmlDocPtr doc;
	doc = cur->doc;
	if (doc != NULL) {
	    if (doc->intSubset == (xmlDtdPtr) cur)
		doc->intSubset = NULL;
	    if (doc->extSubset == (xmlDtdPtr) cur)
		doc->extSubset = NULL;
	}
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlDocPtr doc;
	doc = cur->doc;
	if (doc != NULL) {
	    if (doc->intSubset != NULL) {
	        if (xmlHashLookup(doc->intSubset->entities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->intSubset->entities, cur->name,
		                       NULL);
	        if (xmlHashLookup(doc->intSubset->pentities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->intSubset->pentities, cur->name,
		                       NULL);
	    }
	    if (doc->extSubset != NULL) {
	        if (xmlHashLookup(doc->extSubset->entities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->extSubset->entities, cur->name,
		                       NULL);
	        if (xmlHashLookup(doc->extSubset->pentities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->extSubset->pentities, cur->name,
		                       NULL);
	    }
	}
    }
    if (cur->parent != NULL) {
	xmlNodePtr parent;
	parent = cur->parent;
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (parent->properties == (xmlAttrPtr) cur)
		parent->properties = ((xmlAttrPtr) cur)->next;
	} else {
	    if (parent->children == cur)
		parent->children = cur->next;
	    if (parent->last == cur)
		parent->last = cur->prev;
	}
	cur->parent = NULL;
    }
    if (cur->next != NULL)
        cur->next->prev = cur->prev;
    if (cur->prev != NULL)
        cur->prev->next = cur->next;
    cur->next = cur->prev = NULL;
}